

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_util.cpp
# Opt level: O3

ANNcoord annSpread(ANNpointArray pa,ANNidxArray pidx,int n,int d)

{
  double dVar1;
  ulong uVar2;
  ANNcoord AVar3;
  ANNcoord AVar4;
  double dVar5;
  
  AVar3 = pa[*pidx][d];
  dVar5 = AVar3;
  if (1 < n) {
    uVar2 = 1;
    AVar4 = AVar3;
    do {
      dVar1 = pa[pidx[uVar2]][d];
      dVar5 = dVar1;
      if ((AVar4 <= dVar1) && (dVar5 = AVar4, AVar3 < dVar1)) {
        AVar3 = dVar1;
      }
      uVar2 = uVar2 + 1;
      AVar4 = dVar5;
    } while ((uint)n != uVar2);
  }
  return AVar3 - dVar5;
}

Assistant:

ANNcoord annSpread(    // compute point spread along dimension
    ANNpointArray pa,  // point array
    ANNidxArray pidx,  // point indices
    int n,             // number of points
    int d)             // dimension to check
{
    ANNcoord min = PA(0, d);  // compute max and min coords
    ANNcoord max = PA(0, d);
    for (int i = 1; i < n; i++) {
        ANNcoord c = PA(i, d);
        if (c < min)
            min = c;
        else if (c > max)
            max = c;
    }
    return (max - min);  // total spread is difference
}